

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::SetPendingDataset
          (CommissionerSafe *this,ErrorHandler *aHandler,PendingOperationalDataset *aDataset)

{
  anon_class_264_3_2539074c local_148;
  AsyncRequest local_40;
  PendingOperationalDataset *local_20;
  PendingOperationalDataset *aDataset_local;
  ErrorHandler *aHandler_local;
  CommissionerSafe *this_local;
  
  local_148.this = this;
  local_20 = aDataset;
  aDataset_local = (PendingOperationalDataset *)aHandler;
  aHandler_local = (ErrorHandler *)this;
  std::function<void_(ot::commissioner::Error)>::function(&local_148.aHandler,aHandler);
  PendingOperationalDataset::PendingOperationalDataset(&local_148.aDataset,local_20);
  std::function<void()>::
  function<ot::commissioner::CommissionerSafe::SetPendingDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::PendingOperationalDataset_const&)::__0,void>
            ((function<void()> *)&local_40,&local_148);
  PushAsyncRequest(this,&local_40);
  std::function<void_()>::~function(&local_40);
  SetPendingDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::PendingOperationalDataset_const&)
  ::$_0::~__0((__0 *)&local_148);
  return;
}

Assistant:

void CommissionerSafe::SetPendingDataset(ErrorHandler aHandler, const PendingOperationalDataset &aDataset)
{
    PushAsyncRequest([=]() { mImpl->SetPendingDataset(aHandler, aDataset); });
}